

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O3

bool mkvparser::Colour::Parse
               (IMkvReader *reader,longlong colour_start,longlong colour_size,Colour **colour)

{
  bool bVar1;
  Colour *this;
  long lVar2;
  longlong lVar3;
  bool bVar4;
  long lVar5;
  long stop;
  longlong read_pos;
  longlong child_size;
  longlong child_id;
  long local_60;
  longlong local_58;
  longlong local_50;
  Colour **local_48;
  MasteringMetadata **local_40;
  Colour *local_38;
  
  if ((reader == (IMkvReader *)0x0) || (*colour != (Colour *)0x0)) {
    bVar4 = false;
  }
  else {
    local_48 = colour;
    this = (Colour *)operator_new(0x70);
    this->matrix_coefficients = 0x7fffffffffffffff;
    this->bits_per_channel = 0x7fffffffffffffff;
    this->chroma_subsampling_horz = 0x7fffffffffffffff;
    this->chroma_subsampling_vert = 0x7fffffffffffffff;
    this->cb_subsampling_horz = 0x7fffffffffffffff;
    this->cb_subsampling_vert = 0x7fffffffffffffff;
    this->chroma_siting_horz = 0x7fffffffffffffff;
    this->chroma_siting_vert = 0x7fffffffffffffff;
    this->range = 0x7fffffffffffffff;
    this->transfer_characteristics = 0x7fffffffffffffff;
    this->primaries = 0x7fffffffffffffff;
    this->max_cll = 0x7fffffffffffffff;
    this->max_fall = 0x7fffffffffffffff;
    local_40 = &this->mastering_metadata;
    this->mastering_metadata = (MasteringMetadata *)0x0;
    stop = colour_size + colour_start;
    local_60 = colour_start;
    local_38 = this;
    do {
      bVar4 = stop <= local_60;
      if (stop <= local_60) {
        *local_48 = this;
        return bVar4;
      }
      local_50 = 0;
      local_58 = 0;
      lVar2 = ParseElementHeader(reader,&local_60,stop,&local_50,&local_58);
      lVar3 = local_58;
      lVar5 = local_60;
      if (lVar2 < 0) break;
      switch(local_50) {
      case 0x55b1:
        lVar2 = UnserializeUInt(reader,local_60,local_58);
        this->matrix_coefficients = lVar2;
        break;
      case 0x55b2:
        lVar2 = UnserializeUInt(reader,local_60,local_58);
        this->bits_per_channel = lVar2;
        break;
      case 0x55b3:
        lVar2 = UnserializeUInt(reader,local_60,local_58);
        this->chroma_subsampling_horz = lVar2;
        break;
      case 0x55b4:
        lVar2 = UnserializeUInt(reader,local_60,local_58);
        this->chroma_subsampling_vert = lVar2;
        break;
      case 0x55b5:
        lVar2 = UnserializeUInt(reader,local_60,local_58);
        this->cb_subsampling_horz = lVar2;
        break;
      case 0x55b6:
        lVar2 = UnserializeUInt(reader,local_60,local_58);
        this->cb_subsampling_vert = lVar2;
        break;
      case 0x55b7:
        lVar2 = UnserializeUInt(reader,local_60,local_58);
        this->chroma_siting_horz = lVar2;
        break;
      case 0x55b8:
        lVar2 = UnserializeUInt(reader,local_60,local_58);
        this->chroma_siting_vert = lVar2;
        break;
      case 0x55b9:
        lVar2 = UnserializeUInt(reader,local_60,local_58);
        this->range = lVar2;
        break;
      case 0x55ba:
        lVar2 = UnserializeUInt(reader,local_60,local_58);
        this->transfer_characteristics = lVar2;
        break;
      case 0x55bb:
        lVar2 = UnserializeUInt(reader,local_60,local_58);
        this->primaries = lVar2;
        break;
      case 0x55bc:
        lVar2 = UnserializeUInt(reader,local_60,local_58);
        this->max_cll = lVar2;
        break;
      case 0x55bd:
        lVar2 = UnserializeUInt(reader,local_60,local_58);
        this->max_fall = lVar2;
        break;
      default:
        goto switchD_0016172b_caseD_55be;
      case 0x55d0:
        bVar1 = MasteringMetadata::Parse(reader,local_60,local_58,local_40);
        lVar3 = local_58;
        lVar5 = local_60;
        if (bVar1) goto LAB_00161908;
        goto switchD_0016172b_caseD_55be;
      }
      if (lVar2 < 0) break;
LAB_00161908:
      local_60 = lVar5 + lVar3;
    } while (local_60 <= stop);
switchD_0016172b_caseD_55be:
    ~Colour(this);
    operator_delete(this);
  }
  return bVar4;
}

Assistant:

bool Colour::Parse(IMkvReader* reader, long long colour_start,
                   long long colour_size, Colour** colour) {
  if (!reader || *colour)
    return false;

  std::unique_ptr<Colour> colour_ptr(new Colour());
  if (!colour_ptr.get())
    return false;

  const long long colour_end = colour_start + colour_size;
  long long read_pos = colour_start;

  while (read_pos < colour_end) {
    long long child_id = 0;
    long long child_size = 0;

    const long status =
        ParseElementHeader(reader, read_pos, colour_end, child_id, child_size);
    if (status < 0)
      return false;

    if (child_id == libwebm::kMkvMatrixCoefficients) {
      colour_ptr->matrix_coefficients =
          UnserializeUInt(reader, read_pos, child_size);
      if (colour_ptr->matrix_coefficients < 0)
        return false;
    } else if (child_id == libwebm::kMkvBitsPerChannel) {
      colour_ptr->bits_per_channel =
          UnserializeUInt(reader, read_pos, child_size);
      if (colour_ptr->bits_per_channel < 0)
        return false;
    } else if (child_id == libwebm::kMkvChromaSubsamplingHorz) {
      colour_ptr->chroma_subsampling_horz =
          UnserializeUInt(reader, read_pos, child_size);
      if (colour_ptr->chroma_subsampling_horz < 0)
        return false;
    } else if (child_id == libwebm::kMkvChromaSubsamplingVert) {
      colour_ptr->chroma_subsampling_vert =
          UnserializeUInt(reader, read_pos, child_size);
      if (colour_ptr->chroma_subsampling_vert < 0)
        return false;
    } else if (child_id == libwebm::kMkvCbSubsamplingHorz) {
      colour_ptr->cb_subsampling_horz =
          UnserializeUInt(reader, read_pos, child_size);
      if (colour_ptr->cb_subsampling_horz < 0)
        return false;
    } else if (child_id == libwebm::kMkvCbSubsamplingVert) {
      colour_ptr->cb_subsampling_vert =
          UnserializeUInt(reader, read_pos, child_size);
      if (colour_ptr->cb_subsampling_vert < 0)
        return false;
    } else if (child_id == libwebm::kMkvChromaSitingHorz) {
      colour_ptr->chroma_siting_horz =
          UnserializeUInt(reader, read_pos, child_size);
      if (colour_ptr->chroma_siting_horz < 0)
        return false;
    } else if (child_id == libwebm::kMkvChromaSitingVert) {
      colour_ptr->chroma_siting_vert =
          UnserializeUInt(reader, read_pos, child_size);
      if (colour_ptr->chroma_siting_vert < 0)
        return false;
    } else if (child_id == libwebm::kMkvRange) {
      colour_ptr->range = UnserializeUInt(reader, read_pos, child_size);
      if (colour_ptr->range < 0)
        return false;
    } else if (child_id == libwebm::kMkvTransferCharacteristics) {
      colour_ptr->transfer_characteristics =
          UnserializeUInt(reader, read_pos, child_size);
      if (colour_ptr->transfer_characteristics < 0)
        return false;
    } else if (child_id == libwebm::kMkvPrimaries) {
      colour_ptr->primaries = UnserializeUInt(reader, read_pos, child_size);
      if (colour_ptr->primaries < 0)
        return false;
    } else if (child_id == libwebm::kMkvMaxCLL) {
      colour_ptr->max_cll = UnserializeUInt(reader, read_pos, child_size);
      if (colour_ptr->max_cll < 0)
        return false;
    } else if (child_id == libwebm::kMkvMaxFALL) {
      colour_ptr->max_fall = UnserializeUInt(reader, read_pos, child_size);
      if (colour_ptr->max_fall < 0)
        return false;
    } else if (child_id == libwebm::kMkvMasteringMetadata) {
      if (!MasteringMetadata::Parse(reader, read_pos, child_size,
                                    &colour_ptr->mastering_metadata))
        return false;
    } else {
      return false;
    }

    read_pos += child_size;
    if (read_pos > colour_end)
      return false;
  }
  *colour = colour_ptr.release();
  return true;
}